

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FkLocateIndex(Parse *pParse,Table *pParent,FKey *pFKey,Index **ppIdx,int **paiCol)

{
  uint uVar1;
  char *zRight;
  i16 *piVar2;
  Column *pCVar3;
  int iVar4;
  int *p;
  ulong uVar5;
  Index *pIVar6;
  char *pcVar7;
  ulong uVar8;
  char **ppcVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar1 = pFKey->nCol;
  zRight = pFKey->aCol[0].zCol;
  if ((long)(int)uVar1 == 1) {
    if (-1 < (long)pParent->iPKey) {
      if (zRight == (char *)0x0) {
        return 0;
      }
      iVar4 = sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName,zRight);
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  else if (paiCol != (int **)0x0) {
    p = (int *)sqlite3DbMallocRawNN(pParse->db,(long)(int)uVar1 * 4);
    if (p == (int *)0x0) {
      return 1;
    }
    *paiCol = p;
    goto LAB_00174891;
  }
  p = (int *)0x0;
LAB_00174891:
  pIVar6 = pParent->pIndex;
  if (pIVar6 != (Index *)0x0) {
    uVar5 = (ulong)uVar1;
    do {
      if (((uVar1 == pIVar6->nKeyCol) && (pIVar6->onError != '\0')) &&
         (pIVar6->pPartIdxWhere == (Expr *)0x0)) {
        if (zRight == (char *)0x0) {
          if ((*(ushort *)&pIVar6->field_0x63 & 3) == 2) {
            if (0 < (int)uVar1 && p != (int *)0x0) {
              lVar10 = 0;
              do {
                *(int *)((long)p + lVar10) = (&pFKey->aCol[0].iFrom)[lVar10];
                lVar10 = lVar10 + 4;
              } while (uVar5 << 2 != lVar10);
            }
LAB_00174a38:
            *ppIdx = pIVar6;
            return 0;
          }
        }
        else {
          if ((int)uVar1 < 1) {
            uVar11 = 0;
          }
          else {
            piVar2 = pIVar6->aiColumn;
            uVar12 = 0;
            do {
              lVar10 = (long)piVar2[uVar12];
              if (lVar10 < 0) goto LAB_00174998;
              pCVar3 = pParent->aCol;
              pcVar7 = pCVar3[lVar10].zColl;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = "BINARY";
              }
              iVar4 = sqlite3StrICmp(pIVar6->azColl[uVar12],pcVar7);
              if (iVar4 != 0) goto LAB_00174998;
              pcVar7 = pCVar3[lVar10].zName;
              uVar8 = 0;
              ppcVar9 = &pFKey->aCol[0].zCol;
              do {
                iVar4 = sqlite3StrICmp(*ppcVar9,pcVar7);
                if (iVar4 == 0) {
                  if (p != (int *)0x0) {
                    p[uVar12] = ((sColMap *)(ppcVar9 + -1))->iFrom;
                  }
                  break;
                }
                uVar8 = uVar8 + 1;
                ppcVar9 = ppcVar9 + 2;
              } while (uVar5 != uVar8);
              if (uVar1 == (uint)uVar8) goto LAB_00174998;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar5);
            uVar12 = (ulong)uVar1;
LAB_00174998:
            uVar11 = (uint)uVar12;
          }
          if (uVar11 == uVar1) goto LAB_00174a38;
        }
      }
      pIVar6 = pIVar6->pNext;
    } while (pIVar6 != (Index *)0x0);
  }
  if (pParse->disableTriggers == '\0') {
    sqlite3ErrorMsg(pParse,"foreign key mismatch - \"%w\" referencing \"%w\"",pFKey->pFrom->zName,
                    pFKey->zTo);
  }
  if (p != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,p);
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkLocateIndex(
  Parse *pParse,                  /* Parse context to store any error in */
  Table *pParent,                 /* Parent table of FK constraint pFKey */
  FKey *pFKey,                    /* Foreign key to find index for */
  Index **ppIdx,                  /* OUT: Unique index on parent table */
  int **paiCol                    /* OUT: Map of index columns in pFKey */
){
  Index *pIdx = 0;                    /* Value to return via *ppIdx */
  int *aiCol = 0;                     /* Value to return via *paiCol */
  int nCol = pFKey->nCol;             /* Number of columns in parent key */
  char *zKey = pFKey->aCol[0].zCol;   /* Name of left-most parent key column */

  /* The caller is responsible for zeroing output parameters. */
  assert( ppIdx && *ppIdx==0 );
  assert( !paiCol || *paiCol==0 );
  assert( pParse );

  /* If this is a non-composite (single column) foreign key, check if it 
  ** maps to the INTEGER PRIMARY KEY of table pParent. If so, leave *ppIdx 
  ** and *paiCol set to zero and return early. 
  **
  ** Otherwise, for a composite foreign key (more than one column), allocate
  ** space for the aiCol array (returned via output parameter *paiCol).
  ** Non-composite foreign keys do not require the aiCol array.
  */
  if( nCol==1 ){
    /* The FK maps to the IPK if any of the following are true:
    **
    **   1) There is an INTEGER PRIMARY KEY column and the FK is implicitly 
    **      mapped to the primary key of table pParent, or
    **   2) The FK is explicitly mapped to a column declared as INTEGER
    **      PRIMARY KEY.
    */
    if( pParent->iPKey>=0 ){
      if( !zKey ) return 0;
      if( !sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName, zKey) ) return 0;
    }
  }else if( paiCol ){
    assert( nCol>1 );
    aiCol = (int *)sqlite3DbMallocRawNN(pParse->db, nCol*sizeof(int));
    if( !aiCol ) return 1;
    *paiCol = aiCol;
  }

  for(pIdx=pParent->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->nKeyCol==nCol && IsUniqueIndex(pIdx) && pIdx->pPartIdxWhere==0 ){ 
      /* pIdx is a UNIQUE index (or a PRIMARY KEY) and has the right number
      ** of columns. If each indexed column corresponds to a foreign key
      ** column of pFKey, then this index is a winner.  */

      if( zKey==0 ){
        /* If zKey is NULL, then this foreign key is implicitly mapped to 
        ** the PRIMARY KEY of table pParent. The PRIMARY KEY index may be 
        ** identified by the test.  */
        if( IsPrimaryKeyIndex(pIdx) ){
          if( aiCol ){
            int i;
            for(i=0; i<nCol; i++) aiCol[i] = pFKey->aCol[i].iFrom;
          }
          break;
        }
      }else{
        /* If zKey is non-NULL, then this foreign key was declared to
        ** map to an explicit list of columns in table pParent. Check if this
        ** index matches those columns. Also, check that the index uses
        ** the default collation sequences for each column. */
        int i, j;
        for(i=0; i<nCol; i++){
          i16 iCol = pIdx->aiColumn[i];     /* Index of column in parent tbl */
          const char *zDfltColl;            /* Def. collation for column */
          char *zIdxCol;                    /* Name of indexed column */

          if( iCol<0 ) break; /* No foreign keys against expression indexes */

          /* If the index uses a collation sequence that is different from
          ** the default collation sequence for the column, this index is
          ** unusable. Bail out early in this case.  */
          zDfltColl = pParent->aCol[iCol].zColl;
          if( !zDfltColl ) zDfltColl = sqlite3StrBINARY;
          if( sqlite3StrICmp(pIdx->azColl[i], zDfltColl) ) break;

          zIdxCol = pParent->aCol[iCol].zName;
          for(j=0; j<nCol; j++){
            if( sqlite3StrICmp(pFKey->aCol[j].zCol, zIdxCol)==0 ){
              if( aiCol ) aiCol[i] = pFKey->aCol[j].iFrom;
              break;
            }
          }
          if( j==nCol ) break;
        }
        if( i==nCol ) break;      /* pIdx is usable */
      }
    }
  }

  if( !pIdx ){
    if( !pParse->disableTriggers ){
      sqlite3ErrorMsg(pParse,
           "foreign key mismatch - \"%w\" referencing \"%w\"",
           pFKey->pFrom->zName, pFKey->zTo);
    }
    sqlite3DbFree(pParse->db, aiCol);
    return 1;
  }

  *ppIdx = pIdx;
  return 0;
}